

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_19656::IDLExportVisitor::visit_(IDLExportVisitor *this,OpaqueType *type)

{
  UnsupportedType *this_00;
  string local_40;
  
  if (this->m_exporter->m_opaque_as_any == true) {
    return true;
  }
  this_00 = (UnsupportedType *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"opaque types are not supported for export in IDL","");
  Typelib::UnsupportedType::UnsupportedType(this_00,(Type *)type,&local_40);
  __cxa_throw(this_00,&Typelib::UnsupportedType::typeinfo,Typelib::UnsupportedType::~UnsupportedType
             );
}

Assistant:

bool IDLExportVisitor::visit_(OpaqueType const& type)
    {
        if (m_exporter.marshalOpaquesAsAny())
            return true;

        throw UnsupportedType(type, "opaque types are not supported for export in IDL");
    }